

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRect __thiscall
QStyleSheetStyle::positionRect
          (QStyleSheetStyle *this,QWidget *w,QRenderRule *rule2,int pe,QRect *originRect,
          LayoutDirection dir)

{
  long lVar1;
  bool bVar2;
  PositionMode PVar3;
  Int IVar4;
  int iVar5;
  QStyleSheetPositionData *pQVar6;
  int in_ECX;
  QWidget *in_RSI;
  QSize in_RDI;
  QRect *in_R8;
  QFlagsStorage<Qt::AlignmentFlag> in_R9D;
  long in_FS_OFFSET;
  QRect QVar7;
  int top;
  int left;
  PositionMode mode;
  QStyleSheetPositionData *p;
  QSize sz_1;
  QSize sz;
  Alignment position;
  QRect r;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  QRenderRule *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  QRect *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  PositionMode PVar8;
  Representation RVar9;
  undefined8 local_80;
  undefined8 local_78;
  QRect local_58;
  undefined8 local_44;
  undefined8 local_3c;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QRenderRule::position((QRenderRule *)0x42090f);
  if ((pQVar6 == (QStyleSheetPositionData *)0x0) || (pQVar6->mode == PositionMode_Unknown)) {
    PVar3 = defaultPositionMode(in_ECX);
  }
  else {
    PVar3 = pQVar6->mode;
  }
  PVar8 = PVar3;
  if ((pQVar6 == (QStyleSheetPositionData *)0x0) ||
     (IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&pQVar6->position), IVar4 == 0)) {
    defaultPosition(in_stack_fffffffffffffee8);
  }
  QRect::QRect((QRect *)in_stack_fffffffffffffee0);
  if (PVar3 == PositionMode_Absolute) {
    if (pQVar6 == (QStyleSheetPositionData *)0x0) {
      local_58 = *in_R8;
    }
    else {
      if (in_R9D.i == 0) {
        in_stack_fffffffffffffeec = pQVar6->left;
      }
      else {
        in_stack_fffffffffffffeec = pQVar6->right;
      }
      in_stack_fffffffffffffef0 = pQVar6->top;
      if (in_R9D.i == 0) {
        in_stack_fffffffffffffee8 = pQVar6->right;
      }
      else {
        in_stack_fffffffffffffee8 = pQVar6->left;
      }
      in_stack_fffffffffffffee8 = -in_stack_fffffffffffffee8;
      in_stack_fffffffffffffef4 = in_stack_fffffffffffffeec;
      local_58 = QRect::adjusted((QRect *)CONCAT44(PVar8,in_stack_ffffffffffffff18),
                                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                 (int)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                                 in_stack_ffffffffffffff08);
    }
    QVar7 = local_58;
    RVar9 = in_RDI.wd.m_i;
    local_18._0_4_ = local_58.x1.m_i;
    local_18._4_4_ = local_58.y1.m_i;
    local_58._8_8_ = QVar7._8_8_;
    local_10._0_4_ = local_58.x2.m_i;
    local_10._4_4_ = local_58.y2.m_i;
    bVar2 = QRenderRule::hasContentsSize(in_stack_fffffffffffffee0);
    if (bVar2) {
      QRenderRule::size((QRenderRule *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                       );
      QRenderRule::minimumContentsSize
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (QSize *)in_stack_fffffffffffffee0);
      iVar5 = QSize::width((QSize *)0x420cbb);
      if (iVar5 == -1) {
        QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QSize::setWidth((QSize *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      }
      iVar5 = QSize::height((QSize *)0x420ce9);
      if (iVar5 == -1) {
        QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QSize::setHeight((QSize *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      }
      QVar7 = QStyle::alignedRect(RVar9.m_i,(Alignment)in_R9D.i,
                                  (QSize *)CONCAT44(PVar8,in_stack_ffffffffffffff18),
                                  in_stack_ffffffffffffff10);
      local_80 = QVar7._0_8_;
      local_18 = local_80;
      local_78 = QVar7._8_8_;
      local_10 = local_78;
    }
  }
  else {
    QRenderRule::size((QRenderRule *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    defaultSize((QStyleSheetStyle *)CONCAT44(PVar8,in_stack_ffffffffffffff18),in_RSI,in_RDI,
                (QRect *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                in_stack_ffffffffffffff04);
    RVar9 = in_RDI.wd.m_i;
    QRenderRule::minimumContentsSize
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    QSize::expandedTo((QSize *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                      (QSize *)in_stack_fffffffffffffee0);
    QVar7 = QStyle::alignedRect(RVar9.m_i,(Alignment)in_R9D.i,
                                (QSize *)CONCAT44(PVar8,in_stack_ffffffffffffff18),(QRect *)in_RSI);
    local_44 = QVar7._0_8_;
    local_18 = local_44;
    local_3c = QVar7._8_8_;
    local_10 = local_3c;
    if (pQVar6 != (QStyleSheetPositionData *)0x0) {
      QRect::translate((QRect *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                       in_stack_fffffffffffffed8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar7.x2.m_i = (undefined4)local_10;
    QVar7.y2.m_i = local_10._4_4_;
    QVar7.x1.m_i = (undefined4)local_18;
    QVar7.y1.m_i = local_18._4_4_;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QRect QStyleSheetStyle::positionRect(const QWidget *w, const QRenderRule &rule2, int pe,
                                     const QRect &originRect, Qt::LayoutDirection dir) const
{
    const QStyleSheetPositionData *p = rule2.position();
    PositionMode mode = (p && p->mode != PositionMode_Unknown) ? p->mode : defaultPositionMode(pe);
    Qt::Alignment position = (p && p->position != 0) ? p->position : defaultPosition(pe);
    QRect r;

    if (mode != PositionMode_Absolute) {
        QSize sz = defaultSize(w, rule2.size(), originRect, pe);
        sz = sz.expandedTo(rule2.minimumContentsSize());
        r = QStyle::alignedRect(dir, position, sz, originRect);
        if (p) {
            int left = p->left ? p->left : -p->right;
            int top = p->top ? p->top : -p->bottom;
            r.translate(dir == Qt::LeftToRight ? left : -left, top);
        }
    } else {
        r = p ? originRect.adjusted(dir == Qt::LeftToRight ? p->left : p->right, p->top,
                                   dir == Qt::LeftToRight ? -p->right : -p->left, -p->bottom)
              : originRect;
        if (rule2.hasContentsSize()) {
            QSize sz = rule2.size().expandedTo(rule2.minimumContentsSize());
            if (sz.width() == -1) sz.setWidth(r.width());
            if (sz.height() == -1) sz.setHeight(r.height());
            r = QStyle::alignedRect(dir, position, sz, r);
        }
    }
    return r;
}